

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_remote.c
# Opt level: O2

int remoteConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  int iVar1;
  mpt_named_traits *pmVar2;
  int iVar3;
  mpt_type_t mVar4;
  
  pmVar2 = mpt_input_type_traits();
  if (pmVar2 == (mpt_named_traits *)0x0) {
    mVar4 = 0x100;
LAB_00104053:
    iVar3 = (int)mVar4;
    if (type != 0x100) {
      if (type == 1) {
        if (ptr == (void *)0x0) {
          return iVar3;
        }
        iVar1 = *(int *)&val[6]._vptr;
        if (iVar1 < 0) {
          if ((mpt_streaminfo *)val[5]._vptr == (mpt_streaminfo *)0x0) {
            iVar1 = -1;
          }
          else {
            iVar1 = _mpt_stream_fread((mpt_streaminfo *)val[5]._vptr);
          }
        }
        *(int *)ptr = iVar1;
        return iVar3;
      }
      if (type == 0x81) {
        if (ptr == (void *)0x0) {
          return iVar3;
        }
        val = val + 3;
      }
      else if (type == 0x83) {
        if (ptr == (void *)0x0) {
          return iVar3;
        }
        val = val + 2;
      }
      else {
        if (type != 0x84) {
          if (type != 0) {
            return -3;
          }
          if (ptr == (void *)0x0) {
            return iVar3;
          }
          *(uint8_t **)ptr = remoteConv::fmt;
          return iVar3;
        }
        if (ptr == (void *)0x0) {
          return iVar3;
        }
        val = val + 1;
      }
      goto LAB_0010409b;
    }
  }
  else {
    mVar4 = pmVar2->type;
    if (mVar4 != type) goto LAB_00104053;
  }
  iVar3 = 1;
  if (ptr == (void *)0x0) {
    return 1;
  }
LAB_0010409b:
  *(mpt_convertable **)ptr = val;
  return iVar3;
}

Assistant:

static int remoteConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	const MPT_STRUCT(out_data) *od = MPT_baseaddr(out_data, val, _in);
	const MPT_STRUCT(named_traits) *traits = mpt_input_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((const void **) ptr) = &od->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (!type) {
		static const uint8_t fmt[] = {
			MPT_ENUM(TypeObjectPtr),
			MPT_ENUM(TypeOutputPtr),
			MPT_ENUM(TypeLoggerPtr),
			0
		};
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
		}
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((const void **) ptr) = &od->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (type == MPT_ENUM(TypeUnixSocket)) {
		if (ptr) *((int *) ptr) = remote_infile(od);
		return me;
	}
	if (type == MPT_ENUM(TypeObjectPtr)) {
		if (ptr) *((const void **) ptr) = &od->_obj;
		return me;
	}
	if (type == MPT_ENUM(TypeOutputPtr)) {
		if (ptr) *((const void **) ptr) = &od->_out;
		return me;
	}
	if (type == MPT_ENUM(TypeLoggerPtr)) {
		if (ptr) *((const void **) ptr) = &od->_log;
		return me;
	}
	return MPT_ERROR(BadType);
}